

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O2

size_t benchmark::RunSpecifiedBenchmarks
                 (BenchmarkReporter *console_reporter,BenchmarkReporter *file_reporter)

{
  bool bVar1;
  double dVar2;
  undefined1 auVar3 [16];
  pointer ptVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  ostream *poVar8;
  pointer pTVar9;
  __uniq_ptr_impl<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
  *this;
  Mutex *__m;
  size_t sVar10;
  int iVar11;
  Instance *benchmark_1;
  pointer pIVar12;
  Instance *benchmark;
  pointer pIVar13;
  ulong uVar14;
  pointer __p_00;
  thread *thread_1;
  ulong uVar15;
  pointer ptVar16;
  pointer __p;
  long lVar17;
  bool bVar18;
  bool bVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar29;
  int iVar30;
  undefined1 auVar28 [16];
  double dVar31;
  undefined1 auVar32 [16];
  pointer local_4c8;
  pointer local_4b8;
  double local_498;
  vector<std::thread,_std::allocator<std::thread>_> pool;
  double local_468;
  vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  benchmarks;
  string label;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  local_418;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  complexity_reports;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  stat_reports;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  bool local_3a0;
  _Alloc_hider local_398;
  size_type local_390;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  int64_t local_378;
  TimeUnit local_370;
  double local_368;
  double dStack_360;
  double dStack_358;
  undefined4 uStack_350;
  undefined4 local_34c;
  undefined4 uStack_348;
  undefined8 uStack_344;
  BigOFunc *local_338;
  int local_330;
  undefined2 local_32c;
  ThreadStats total;
  string spec;
  string mem;
  Context context;
  Notification done;
  ofstream output_file;
  
  std::__cxx11::string::string((string *)&spec,(string *)&FLAGS_benchmark_filter_abi_cxx11_);
  if ((spec._M_string_length == 0) || (bVar5 = std::operator==(&spec,"all"), bVar5)) {
    std::__cxx11::string::assign((char *)&spec);
  }
  benchmarks.
  super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  benchmarks.
  super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  benchmarks.
  super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  internal::BenchmarkFamilies::GetInstance();
  bVar5 = internal::BenchmarkFamilies::FindBenchmarks
                    (&internal::BenchmarkFamilies::GetInstance::instance,&spec,&benchmarks);
  pIVar12 = benchmarks.
            super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (bVar5) {
    pIVar13 = benchmarks.
              super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (FLAGS_benchmark_list_tests == true) {
      for (; pIVar13 != pIVar12; pIVar13 = pIVar13 + 1) {
        poVar8 = std::operator<<((ostream *)&std::cout,(string *)pIVar13);
        std::operator<<(poVar8,"\n");
      }
    }
    else {
      std::ofstream::ofstream(&output_file);
      if (console_reporter == (BenchmarkReporter *)0x0) {
        internal::anon_unknown_7::CreateReporter
                  ((anon_unknown_7 *)&stat_reports,&FLAGS_benchmark_format_abi_cxx11_,
                   (uint)FLAGS_color_print);
        local_4b8 = stat_reports.
                    super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        console_reporter =
             (BenchmarkReporter *)
             stat_reports.
             super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        local_4b8 = (pointer)0x0;
      }
      bVar5 = std::operator==(&FLAGS_benchmark_out_abi_cxx11_,"");
      if ((file_reporter != (BenchmarkReporter *)0x0) && (bVar5)) {
        poVar8 = std::operator<<((ostream *)&std::cerr,
                                 "A custom file reporter was provided but --benchmark_out=<file> was not specified."
                                );
        std::endl<char,std::char_traits<char>>(poVar8);
LAB_001268ad:
        exit(1);
      }
      bVar5 = std::operator!=(&FLAGS_benchmark_out_abi_cxx11_,"");
      if (bVar5) {
        std::ofstream::open((string *)&output_file,0x14b948);
        cVar6 = std::__basic_file<char>::is_open();
        if (cVar6 == '\0') {
          poVar8 = std::operator<<((ostream *)&std::cerr,"invalid file name: \'");
          poVar8 = std::operator<<(poVar8,(string *)&FLAGS_benchmark_out_abi_cxx11_);
          std::endl<char,std::char_traits<char>>(poVar8);
          goto LAB_001268ad;
        }
        if (file_reporter == (BenchmarkReporter *)0x0) {
          internal::anon_unknown_7::CreateReporter
                    ((anon_unknown_7 *)&stat_reports,&FLAGS_benchmark_out_format_abi_cxx11_,OO_None)
          ;
          local_4c8 = stat_reports.
                      super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          file_reporter =
               (BenchmarkReporter *)
               stat_reports.
               super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
               ._M_impl.super__Vector_impl_data._M_start;
        }
        else {
          local_4c8 = (pointer)0x0;
        }
        (((pointer)file_reporter)->benchmark_name)._M_string_length = (size_type)&output_file;
        (((pointer)file_reporter)->benchmark_name).field_2._M_allocated_capacity =
             (size_type)&output_file;
      }
      else {
        local_4c8 = (pointer)0x0;
      }
      if ((pointer)console_reporter == (pointer)0x0) {
        internal::CheckHandler::CheckHandler
                  ((CheckHandler *)&stat_reports,"console_reporter != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
                   ,"RunMatchingBenchmarks",0x400);
        internal::CheckHandler::~CheckHandler((CheckHandler *)&stat_reports);
      }
      internal::GetNullLogInstance();
      bVar5 = 1 < FLAGS_benchmark_repetitions;
      uVar15 = 10;
      for (pIVar12 = benchmarks.
                     super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pIVar12 !=
          benchmarks.
          super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
          ._M_impl.super__Vector_impl_data._M_finish; pIVar12 = pIVar12 + 1) {
        uVar14 = (pIVar12->name)._M_string_length;
        if (uVar15 <= uVar14) {
          uVar15 = uVar14;
        }
        bVar5 = (bool)(bVar5 | 1 < pIVar12->repetitions);
      }
      uVar14 = uVar15 + 7;
      if (!bVar5) {
        uVar14 = uVar15;
      }
      context.num_cpus = NumCPUs();
      dVar20 = CyclesPerSecond();
      context.mhz_per_cpu = dVar20 / 1000000.0;
      context.cpu_scaling_enabled = CpuScalingEnabled();
      complexity_reports.
      super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      complexity_reports.
      super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      complexity_reports.
      super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      context.name_field_width = uVar14;
      iVar7 = (**(_func_int **)(((pointer)console_reporter)->benchmark_name)._M_dataplus._M_p)
                        (console_reporter);
      if (((char)iVar7 != '\0') &&
         (((pointer)file_reporter == (pointer)0x0 ||
          (iVar7 = (**(_func_int **)(((pointer)file_reporter)->benchmark_name)._M_dataplus._M_p)
                             (file_reporter,&context), (char)iVar7 != '\0')))) {
        pIVar12 = benchmarks.
                  super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (pIVar13 = benchmarks.
                       super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                       ._M_impl.super__Vector_impl_data._M_start; pIVar13 != pIVar12;
            pIVar13 = pIVar13 + 1) {
          local_418.
          super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_418.
          super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_418.
          super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          ._M_impl.super__Vector_impl_data._M_finish = (Run *)0x0;
          pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          if (pIVar13->multithreaded == true) {
            std::vector<std::thread,_std::allocator<std::thread>_>::resize
                      (&pool,(long)pIVar13->threads);
          }
          iVar7 = pIVar13->repetitions;
          if (pIVar13->repetitions == 0) {
            iVar7 = FLAGS_benchmark_repetitions;
          }
          cVar6 = '\0';
          if ((iVar7 != 1) &&
             (cVar6 = FLAGS_benchmark_report_aggregates_only, pIVar13->report_mode != RM_Unspecified
             )) {
            cVar6 = pIVar13->report_mode == RM_ReportAggregatesOnly;
          }
          if (iVar7 < 1) {
            iVar7 = 0;
          }
          uVar15 = 1;
          for (iVar11 = 0;
              ptVar4 = pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                       super__Vector_impl_data._M_finish, iVar11 != iVar7; iVar11 = iVar11 + 1) {
            mem._M_dataplus._M_p = (pointer)&mem.field_2;
            mem._M_string_length = 0;
            mem.field_2._M_local_buf[0] = '\0';
            do {
              poVar8 = internal::GetLogInstanceForLevel(2);
              poVar8 = std::operator<<(poVar8,"-- LOG(");
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,2);
              poVar8 = std::operator<<(poVar8,"): ");
              poVar8 = std::operator<<(poVar8,"Running ");
              poVar8 = std::operator<<(poVar8,(string *)pIVar13);
              poVar8 = std::operator<<(poVar8," for ");
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
              std::operator<<(poVar8,"\n");
              pTVar9 = (pointer)GetBenchmarkLock();
              std::unique_lock<std::mutex>::unique_lock
                        ((unique_lock<std::mutex> *)&stat_reports,(mutex_type *)pTVar9);
              (anonymous_namespace)::GetReportLabel_abi_cxx11_();
              (anonymous_namespace)::GetReportLabel[abi:cxx11]()::label_abi_cxx11_._M_string_length
                   = 0;
              *(anonymous_namespace)::GetReportLabel[abi:cxx11]()::label_abi_cxx11_._M_dataplus._M_p
                   = '\0';
              std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&stat_reports);
              LOCK();
              (anonymous_namespace)::error_message = 0;
              UNLOCK();
              Notification::Notification(&done);
              this = (__uniq_ptr_impl<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                      *)operator_new(0xa8);
              iVar29 = pIVar13->threads;
              this[4]._M_t.
              super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
              .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
              _M_head_impl = (TimerManager *)0x0;
              this[2]._M_t.
              super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
              .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
              _M_head_impl = (TimerManager *)0x0;
              this[3]._M_t.
              super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
              .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
              _M_head_impl = (TimerManager *)0x0;
              (this->_M_t).
              super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
              .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
              _M_head_impl = (TimerManager *)0x0;
              this[1]._M_t.
              super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
              .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
              _M_head_impl = (TimerManager *)0x0;
              std::condition_variable::condition_variable((condition_variable *)(this + 5));
              *(int *)&this[0xb]._M_t.
                       super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                       .
                       super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>
                       ._M_head_impl = iVar29;
              *(int *)((long)&this[0xb]._M_t.
                              super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                              .
                              super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>
                              ._M_head_impl + 4) = iVar29;
              this[0xc]._M_t.
              super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
              .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
              _M_head_impl = (TimerManager *)&done;
              *(undefined1 *)
               &this[0xd]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = 0;
              this[0x10]._M_t.
              super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
              .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
              _M_head_impl = (TimerManager *)0x0;
              this[0x11]._M_t.
              super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
              .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
              _M_head_impl = (TimerManager *)0x0;
              *(undefined4 *)
               &this[0x14]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = 0;
              this[0x12]._M_t.
              super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
              .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
              _M_head_impl = (TimerManager *)0x0;
              this[0x13]._M_t.
              super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
              .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
              _M_head_impl = (TimerManager *)0x0;
              stat_reports.
              super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              std::
              __uniq_ptr_impl<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
              ::reset(this,pTVar9);
              std::
              unique_ptr<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
              ::~unique_ptr((unique_ptr<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                             *)&stat_reports);
              ptVar4 = pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              total.complexity_n = 0;
              total.bytes_processed = 0;
              total.items_processed = 0;
              (anonymous_namespace)::running_benchmark = 1;
              ptVar16 = pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if (pIVar13->multithreaded == true) {
                for (; ptVar16 != ptVar4; ptVar16 = ptVar16 + 1) {
                  if ((ptVar16->_M_id)._M_thread != 0) {
                    std::thread::join();
                  }
                }
                lVar17 = 0;
                for (uVar14 = 0;
                    uVar14 < (ulong)((long)pool.
                                           super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pool.
                                           super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3);
                    uVar14 = uVar14 + 1) {
                  label._M_dataplus._M_p = (pointer)0x0;
                  stat_reports.
                  super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x30);
                  ((stat_reports.
                    super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                    ._M_impl.super__Vector_impl_data._M_start)->benchmark_name)._M_dataplus._M_p =
                       (pointer)&PTR___State_0014a880;
                  ((stat_reports.
                    super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                    ._M_impl.super__Vector_impl_data._M_start)->benchmark_name)._M_string_length =
                       (size_type)&total;
                  *(int *)&((stat_reports.
                             super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                             ._M_impl.super__Vector_impl_data._M_start)->benchmark_name).field_2 =
                       (int)uVar14;
                  *(ulong *)((long)&((stat_reports.
                                      super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->benchmark_name).
                                    field_2 + 8) = uVar15;
                  ((stat_reports.
                    super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                    ._M_impl.super__Vector_impl_data._M_start)->report_label)._M_dataplus._M_p =
                       (pointer)pIVar13;
                  ((stat_reports.
                    super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                    ._M_impl.super__Vector_impl_data._M_start)->report_label)._M_string_length =
                       (size_type)anon_unknown_1::RunInThread;
                  std::thread::_M_start_thread(&label,(Run *)&stat_reports,0);
                  if (stat_reports.
                      super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    (**(code **)(((stat_reports.
                                   super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->benchmark_name).
                                 _M_dataplus._M_p + 8))();
                  }
                  std::thread::operator=
                            ((thread *)
                             ((long)&((pool.
                                       super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_id)._M_thread
                             + lVar17),(thread *)&label);
                  std::thread::~thread((thread *)&label);
                  lVar17 = lVar17 + 8;
                }
              }
              else {
                anon_unknown_1::RunInThread(pIVar13,uVar15,0,&total);
              }
              Notification::WaitForNotification(&done);
              pTVar9 = (anonymous_namespace)::timer_manager;
              (anonymous_namespace)::running_benchmark = 0;
              std::unique_lock<std::mutex>::unique_lock
                        ((unique_lock<std::mutex> *)&stat_reports,
                         (mutex_type *)(anonymous_namespace)::timer_manager);
              if (pTVar9->running_ != false) {
                internal::CheckHandler::CheckHandler
                          ((CheckHandler *)&label,"!running_",
                           "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
                           ,"cpu_time_used",0xf4);
                internal::CheckHandler::~CheckHandler((CheckHandler *)&label);
              }
              internal::GetNullLogInstance();
              dVar20 = pTVar9->cpu_time_used_;
              std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&stat_reports);
              pTVar9 = (anonymous_namespace)::timer_manager;
              std::unique_lock<std::mutex>::unique_lock
                        ((unique_lock<std::mutex> *)&stat_reports,
                         (mutex_type *)(anonymous_namespace)::timer_manager);
              if (pTVar9->running_ != false) {
                internal::CheckHandler::CheckHandler
                          ((CheckHandler *)&label,"!running_",
                           "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
                           ,"real_time_used",0xed);
                internal::CheckHandler::~CheckHandler((CheckHandler *)&label);
              }
              internal::GetNullLogInstance();
              dVar23 = pTVar9->real_time_used_;
              std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&stat_reports);
              pTVar9 = (anonymous_namespace)::timer_manager;
              __p_00 = (anonymous_namespace)::timer_manager;
              std::unique_lock<std::mutex>::unique_lock
                        ((unique_lock<std::mutex> *)&stat_reports,
                         (mutex_type *)(anonymous_namespace)::timer_manager);
              if (pTVar9->running_ != false) {
                internal::CheckHandler::CheckHandler
                          ((CheckHandler *)&label,"!running_",
                           "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
                           ,"manual_time_used",0xfb);
                internal::CheckHandler::~CheckHandler((CheckHandler *)&label);
              }
              internal::GetNullLogInstance();
              local_468 = pTVar9->manual_time_used_;
              std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&stat_reports);
              std::
              __uniq_ptr_impl<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
              ::reset((__uniq_ptr_impl<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                       *)0x0,__p_00);
              poVar8 = internal::GetLogInstanceForLevel(2);
              poVar8 = std::operator<<(poVar8,"-- LOG(");
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,2);
              poVar8 = std::operator<<(poVar8,"): ");
              std::operator<<(poVar8,"Ran in ");
              poVar8 = std::ostream::_M_insert<double>(dVar20);
              std::operator<<(poVar8,"/");
              poVar8 = std::ostream::_M_insert<double>(dVar23);
              std::operator<<(poVar8,"\n");
              dVar21 = local_468;
              if ((pIVar13->use_manual_time == false) &&
                 (dVar21 = dVar20, pIVar13->use_real_time == true)) {
                dVar21 = dVar23;
              }
              label._M_dataplus._M_p = (pointer)&label.field_2;
              label._M_string_length = 0;
              label.field_2._M_local_buf[0] = '\0';
              __m = GetBenchmarkLock();
              std::unique_lock<std::mutex>::unique_lock
                        ((unique_lock<std::mutex> *)&stat_reports,&__m->mut_);
              (anonymous_namespace)::GetReportLabel_abi_cxx11_();
              std::__cxx11::string::_M_assign((string *)&label);
              std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&stat_reports);
              lVar17 = (anonymous_namespace)::error_message;
              uVar14 = -(ulong)(ABS(pIVar13->min_time) < 2.220446049250313e-16);
              dVar2 = (double)(~uVar14 & (ulong)pIVar13->min_time |
                              (ulong)FLAGS_benchmark_min_time & uVar14);
              bVar19 = (anonymous_namespace)::error_message == 0;
              bVar18 = uVar15 < 1000000000;
              bVar5 = dVar23 < dVar2 * 5.0;
              if (bVar5 && (dVar21 < dVar2 && ((bVar18 && iVar11 == 0) && bVar19))) {
                local_498 = 1e-09;
                if (1e-09 <= dVar21) {
                  local_498 = dVar21;
                }
                local_498 = (dVar2 * 1.4) / local_498;
                if (dVar21 / dVar2 <= 0.1 && 10.0 <= local_498) {
                  local_498 = 10.0;
                }
                poVar8 = internal::GetLogInstanceForLevel(3);
                poVar8 = std::operator<<(poVar8,"-- LOG(");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,3);
                poVar8 = std::operator<<(poVar8,"): ");
                std::operator<<(poVar8,"Next iters: ");
                dVar31 = (double)(~-(ulong)(1.0 < local_498) & 0x4000000000000000 |
                                 (ulong)local_498 & -(ulong)(1.0 < local_498));
                dVar23 = dVar31 * (double)(long)uVar15;
                dVar20 = (double)(long)uVar15 + 1.0;
                if (dVar20 <= dVar23) {
                  dVar20 = dVar23;
                }
                dVar23 = 1000000000.0;
                if (dVar20 <= 1000000000.0) {
                  dVar23 = dVar20;
                }
                poVar8 = std::ostream::_M_insert<double>(dVar23);
                std::operator<<(poVar8,", ");
                poVar8 = std::ostream::_M_insert<double>(dVar31);
                std::operator<<(poVar8,"\n");
                uVar15 = (ulong)(int)(dVar23 + 0.5);
              }
              else {
                stat_reports.
                super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)&stat_reports.
                               super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
                stat_reports.
                super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                stat_reports.
                super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                local_3c0._M_allocated_capacity = (size_type)&local_3b0;
                local_3c0._8_8_ = 0;
                local_3b0._M_local_buf[0] = '\0';
                local_3a0 = false;
                local_398._M_p = (pointer)&local_388;
                local_390 = 0;
                local_388._M_local_buf[0] = '\0';
                local_378 = 1;
                local_370 = kNanosecond;
                local_330 = 0;
                local_32c._0_1_ = false;
                local_32c._1_1_ = false;
                uStack_348 = 0;
                uStack_344 = 0;
                dStack_358 = 0.0;
                uStack_350 = 0;
                local_34c = 0;
                local_368 = 0.0;
                dStack_360 = 0.0;
                std::__cxx11::string::_M_assign((string *)&stat_reports);
                local_3a0 = lVar17 != 0;
                std::__cxx11::string::assign((char *)&local_398);
                std::__cxx11::string::_M_assign((string *)local_3c0._M_local_buf);
                local_378 = (long)pIVar13->threads * uVar15;
                local_370 = pIVar13->time_unit;
                if (local_3a0 == false) {
                  bVar1 = 0.0 < dVar21;
                  if (pIVar13->use_manual_time == false) {
                    local_468 = dVar23;
                  }
                  local_368 = local_468;
                  auVar3._8_8_ = total.items_processed;
                  auVar3._0_8_ = total.bytes_processed;
                  auVar24 = auVar3 ^ _DAT_0013a150;
                  auVar28._0_4_ = -(uint)((int)DAT_0013a150 < auVar24._0_4_);
                  iVar29 = -(uint)(DAT_0013a150._4_4_ < auVar24._4_4_);
                  auVar28._8_4_ = -(uint)(DAT_0013a150._8_4_ < auVar24._8_4_);
                  iVar30 = -(uint)(DAT_0013a150._12_4_ < auVar24._12_4_);
                  auVar32._4_4_ = iVar29;
                  auVar32._0_4_ = iVar29;
                  auVar32._8_4_ = iVar30;
                  auVar32._12_4_ = iVar30;
                  auVar25._4_4_ = -(uint)(auVar24._4_4_ == DAT_0013a150._4_4_);
                  auVar25._12_4_ = -(uint)(auVar24._12_4_ == DAT_0013a150._12_4_);
                  auVar25._0_4_ = auVar25._4_4_;
                  auVar25._8_4_ = auVar25._12_4_;
                  auVar26._1_3_ = 0;
                  auVar26[0] = bVar1;
                  auVar28._4_4_ = auVar28._0_4_;
                  auVar28._12_4_ = auVar28._8_4_;
                  auVar26[4] = bVar1;
                  auVar26._5_3_ = 0;
                  auVar26[8] = bVar1;
                  auVar26._9_3_ = 0;
                  auVar26[0xc] = bVar1;
                  auVar26._13_3_ = 0;
                  auVar26 = auVar26 & (auVar28 & auVar25 | auVar32);
                  auVar27._0_8_ =
                       CONCAT44((auVar26._4_4_ << 0x1f) >> 0x1f,(auVar26._0_4_ << 0x1f) >> 0x1f);
                  auVar27._8_4_ = (auVar26._8_4_ << 0x1f) >> 0x1f;
                  auVar27._12_4_ = (auVar26._12_4_ << 0x1f) >> 0x1f;
                  auVar24 = auVar3 & _DAT_0013a160 | _DAT_0013a170;
                  auVar22._0_8_ =
                       ((double)((ulong)total.bytes_processed >> 0x20 | 0x4530000000000000) -
                       1.9342813118337666e+25) + auVar24._0_8_;
                  auVar22._8_8_ =
                       ((double)((ulong)total.items_processed >> 0x20 | 0x4530000000000000) -
                       1.9342813118337666e+25) + auVar24._8_8_;
                  auVar24._8_8_ = dVar21;
                  auVar24._0_8_ = dVar21;
                  auVar24 = divpd(auVar22,auVar24);
                  dStack_358 = (double)(auVar24._0_8_ & auVar27._0_8_);
                  uVar14 = auVar24._8_8_ & auVar27._8_8_;
                  uStack_350 = (undefined4)uVar14;
                  local_34c = (undefined4)(uVar14 >> 0x20);
                  local_330 = total.complexity_n;
                  uStack_344._4_4_ = pIVar13->complexity;
                  local_338 = pIVar13->complexity_lambda;
                  dStack_360 = dVar20;
                  if (pIVar13->complexity != oNone) {
                    std::
                    vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                    ::push_back(&complexity_reports,(Run *)&stat_reports);
                  }
                }
                std::
                vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                ::push_back(&local_418,(Run *)&stat_reports);
                BenchmarkReporter::Run::~Run((Run *)&stat_reports);
              }
              std::__cxx11::string::~string((string *)&label);
              std::condition_variable::~condition_variable(&done.cv_);
            } while (bVar5 && (dVar21 < dVar2 && ((bVar18 && iVar11 == 0) && bVar19)));
            std::__cxx11::string::~string((string *)&mem);
          }
          ptVar16 = pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (pIVar13->multithreaded != false) {
            for (; ptVar16 != ptVar4; ptVar16 = ptVar16 + 1) {
              std::thread::join();
            }
          }
          ComputeStats(&stat_reports,&local_418);
          if ((pIVar13->complexity != oNone) && (pIVar13->last_benchmark_instance == true)) {
            ComputeBigO((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                         *)&done,&complexity_reports);
            std::
            vector<benchmark::BenchmarkReporter::Run,std::allocator<benchmark::BenchmarkReporter::Run>>
            ::
            insert<__gnu_cxx::__normal_iterator<benchmark::BenchmarkReporter::Run*,std::vector<benchmark::BenchmarkReporter::Run,std::allocator<benchmark::BenchmarkReporter::Run>>>,void>
                      ((vector<benchmark::BenchmarkReporter::Run,std::allocator<benchmark::BenchmarkReporter::Run>>
                        *)&stat_reports,
                       (const_iterator)
                       stat_reports.
                       super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (__normal_iterator<benchmark::BenchmarkReporter::Run_*,_std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>_>
                        )done.mutex_.mut_.super___mutex_base._M_mutex.__align,
                       (__normal_iterator<benchmark::BenchmarkReporter::Run_*,_std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>_>
                        )done.mutex_.mut_.super___mutex_base._M_mutex._8_8_);
            std::
            vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
            ::clear(&complexity_reports);
            std::
            vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
            ::~vector((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                       *)&done);
          }
          if (cVar6 != '\0') {
            std::
            vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
            ::clear(&local_418);
          }
          std::
          vector<benchmark::BenchmarkReporter::Run,std::allocator<benchmark::BenchmarkReporter::Run>>
          ::
          insert<__gnu_cxx::__normal_iterator<benchmark::BenchmarkReporter::Run*,std::vector<benchmark::BenchmarkReporter::Run,std::allocator<benchmark::BenchmarkReporter::Run>>>,void>
                    ((vector<benchmark::BenchmarkReporter::Run,std::allocator<benchmark::BenchmarkReporter::Run>>
                      *)&local_418,
                     (const_iterator)
                     local_418.
                     super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (__normal_iterator<benchmark::BenchmarkReporter::Run_*,_std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>_>
                      )stat_reports.
                       super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<benchmark::BenchmarkReporter::Run_*,_std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>_>
                      )stat_reports.
                       super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
          std::
          vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          ::~vector(&stat_reports);
          std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&pool);
          (**(_func_int **)
             ((long)(((pointer)console_reporter)->benchmark_name)._M_dataplus._M_p + 8))
                    (console_reporter,
                     (vector<benchmark::BenchmarkReporter::Run,std::allocator<benchmark::BenchmarkReporter::Run>>
                      *)&local_418);
          if ((pointer)file_reporter != (pointer)0x0) {
            (**(_func_int **)((long)(((pointer)file_reporter)->benchmark_name)._M_dataplus._M_p + 8)
            )(file_reporter,
              (vector<benchmark::BenchmarkReporter::Run,std::allocator<benchmark::BenchmarkReporter::Run>>
               *)&local_418);
          }
          std::
          vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          ::~vector(&local_418);
        }
      }
      (**(_func_int **)((long)(((pointer)console_reporter)->benchmark_name)._M_dataplus._M_p + 0x10)
      )();
      if ((pointer)file_reporter != (pointer)0x0) {
        (**(_func_int **)((long)(((pointer)file_reporter)->benchmark_name)._M_dataplus._M_p + 0x10))
                  ();
      }
      std::
      vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
      ::~vector(&complexity_reports);
      if (local_4c8 != (pointer)0x0) {
        (**(code **)((local_4c8->benchmark_name)._M_dataplus._M_p + 0x20))();
      }
      if (local_4b8 != (pointer)0x0) {
        (**(code **)((local_4b8->benchmark_name)._M_dataplus._M_p + 0x20))();
      }
      std::ofstream::~ofstream(&output_file);
    }
    sVar10 = ((long)benchmarks.
                    super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)benchmarks.
                   super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x78;
  }
  else {
    sVar10 = 0;
  }
  std::
  vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  ::~vector(&benchmarks);
  std::__cxx11::string::~string((string *)&spec);
  return sVar10;
}

Assistant:

size_t RunSpecifiedBenchmarks(BenchmarkReporter* console_reporter,
                              BenchmarkReporter* file_reporter) {
  std::string spec = FLAGS_benchmark_filter;
  if (spec.empty() || spec == "all")
    spec = ".";  // Regexp that matches all benchmarks

  std::vector<internal::Benchmark::Instance> benchmarks;
  auto families = internal::BenchmarkFamilies::GetInstance();
  if (!families->FindBenchmarks(spec, &benchmarks)) return 0;

  if (FLAGS_benchmark_list_tests) {
    for (auto const& benchmark : benchmarks)
      std::cout <<  benchmark.name << "\n";
  } else {
    // Setup the reporters
    std::ofstream output_file;
    std::unique_ptr<BenchmarkReporter> default_console_reporter;
    std::unique_ptr<BenchmarkReporter> default_file_reporter;
    if (!console_reporter) {
      auto output_opts = FLAGS_color_print ? ConsoleReporter::OO_Color
                                           : ConsoleReporter::OO_None;
      default_console_reporter = internal::CreateReporter(
          FLAGS_benchmark_format, output_opts);
      console_reporter = default_console_reporter.get();
    }
    std::string const& fname = FLAGS_benchmark_out;
    if (fname == "" && file_reporter) {
      std::cerr << "A custom file reporter was provided but "
                   "--benchmark_out=<file> was not specified." << std::endl;
      std::exit(1);
    }
    if (fname != "") {
      output_file.open(fname);
      if (!output_file.is_open()) {
        std::cerr << "invalid file name: '" << fname << std::endl;
        std::exit(1);
      }
      if (!file_reporter) {
        default_file_reporter = internal::CreateReporter(
            FLAGS_benchmark_out_format, ConsoleReporter::OO_None);
        file_reporter = default_file_reporter.get();
      }
      file_reporter->SetOutputStream(&output_file);
      file_reporter->SetErrorStream(&output_file);
    }
    internal::RunMatchingBenchmarks(benchmarks, console_reporter, file_reporter);
  }
  return benchmarks.size();
}